

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O0

int __thiscall MovDemuxer::mov_read_tfhd(MovDemuxer *this,MOVAtom atom)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  reference pMVar4;
  VodCoreException *this_00;
  int64_t iVar5;
  uint local_224;
  uint local_220;
  uint local_21c;
  string local_1f8;
  ostringstream local_1c8 [8];
  ostringstream ss;
  MOVTrackExt *i;
  iterator __end1;
  iterator __begin1;
  vector<MovDemuxer::MOVTrackExt,_std::allocator<MovDemuxer::MOVTrackExt>_> *__range1;
  int track_id;
  int flags;
  MOVTrackExt *trex;
  MOVFragment *frag;
  MovDemuxer *this_local;
  
  _track_id = (reference)0x0;
  IOContextDemuxer::get_byte(&this->super_IOContextDemuxer);
  uVar2 = IOContextDemuxer::get_be24(&this->super_IOContextDemuxer);
  uVar3 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
  if (((int)uVar3 < 1) || ((this->super_IOContextDemuxer).num_tracks < (int)uVar3)) {
    this_local._4_4_ = -1;
  }
  else {
    (this->fragment).track_id = uVar3;
    __end1 = std::vector<MovDemuxer::MOVTrackExt,_std::allocator<MovDemuxer::MOVTrackExt>_>::begin
                       (&this->trex_data);
    i = (MOVTrackExt *)
        std::vector<MovDemuxer::MOVTrackExt,_std::allocator<MovDemuxer::MOVTrackExt>_>::end
                  (&this->trex_data);
    while ((bVar1 = __gnu_cxx::operator!=
                              (&__end1,(__normal_iterator<MovDemuxer::MOVTrackExt_*,_std::vector<MovDemuxer::MOVTrackExt,_std::allocator<MovDemuxer::MOVTrackExt>_>_>
                                        *)&i), pMVar4 = _track_id, bVar1 &&
           (pMVar4 = __gnu_cxx::
                     __normal_iterator<MovDemuxer::MOVTrackExt_*,_std::vector<MovDemuxer::MOVTrackExt,_std::allocator<MovDemuxer::MOVTrackExt>_>_>
                     ::operator*(&__end1), pMVar4->track_id != (this->fragment).track_id))) {
      __gnu_cxx::
      __normal_iterator<MovDemuxer::MOVTrackExt_*,_std::vector<MovDemuxer::MOVTrackExt,_std::allocator<MovDemuxer::MOVTrackExt>_>_>
      ::operator++(&__end1);
    }
    _track_id = pMVar4;
    if (_track_id == (reference)0x0) {
      std::__cxx11::ostringstream::ostringstream(local_1c8);
      std::operator<<((ostream *)local_1c8,"could not find corresponding trex");
      this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      VodCoreException::VodCoreException(this_00,3,&local_1f8);
      __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    if ((uVar2 & 1) == 0) {
      (this->fragment).base_data_offset = (this->fragment).moof_offset;
    }
    else {
      iVar5 = IOContextDemuxer::get_be64(&this->super_IOContextDemuxer);
      (this->fragment).base_data_offset = iVar5;
    }
    if ((uVar2 & 2) == 0) {
      (this->fragment).stsd_id = _track_id->stsd_id;
    }
    else {
      uVar3 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
      (this->fragment).stsd_id = uVar3;
    }
    if ((uVar2 & 8) == 0) {
      local_21c = _track_id->duration;
    }
    else {
      local_21c = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
    }
    (this->fragment).duration = local_21c;
    if ((uVar2 & 0x10) == 0) {
      local_220 = _track_id->size;
    }
    else {
      local_220 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
    }
    (this->fragment).size = local_220;
    if ((uVar2 & 0x20) == 0) {
      local_224 = _track_id->flags;
    }
    else {
      local_224 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
    }
    (this->fragment).flags = local_224;
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int MovDemuxer::mov_read_tfhd(MOVAtom atom)
{
    MOVFragment* frag = &fragment;
    const MOVTrackExt* trex = nullptr;

    get_byte();  // version
    const int flags = get_be24();

    const int track_id = static_cast<int>(get_be32());
    if (track_id <= 0 || track_id > num_tracks)
        return -1;
    frag->track_id = track_id;
    for (const auto& i : trex_data)
        if (i.track_id == frag->track_id)
        {
            trex = &i;
            break;
        }
    if (!trex)
        THROW(ERR_COMMON, "could not find corresponding trex")

    if (flags & 0x01)
        frag->base_data_offset = get_be64();
    else
        frag->base_data_offset = frag->moof_offset;
    if (flags & 0x02)
        frag->stsd_id = get_be32();
    else
        frag->stsd_id = trex->stsd_id;

    frag->duration = flags & 0x08 ? get_be32() : trex->duration;
    frag->size = flags & 0x10 ? get_be32() : trex->size;
    frag->flags = flags & 0x20 ? get_be32() : trex->flags;
    return 0;
}